

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

ngx_int_t ngx_add_path(ngx_conf_t *cf,ngx_path_t **slot)

{
  ngx_path_t *pnVar1;
  ngx_cycle_t *pnVar2;
  void *pvVar3;
  size_t sVar4;
  ngx_path_t *pnVar5;
  ngx_log_t *log;
  int iVar6;
  long *plVar7;
  long lVar8;
  char *fmt;
  u_char *puVar9;
  ngx_uint_t nVar10;
  bool bVar11;
  ngx_uint_t nVar12;
  
  pnVar1 = *slot;
  pnVar2 = cf->cycle;
  nVar12 = (pnVar2->paths).nelts;
  if (nVar12 != 0) {
    pvVar3 = (pnVar2->paths).elts;
    sVar4 = (pnVar1->name).len;
    nVar10 = 0;
    do {
      pnVar5 = *(ngx_path_t **)((long)pvVar3 + nVar10 * 8);
      if (((pnVar5->name).len == sVar4) &&
         (iVar6 = strcmp((char *)(pnVar5->name).data,(char *)(pnVar1->name).data), iVar6 == 0)) {
        if (pnVar5->data == pnVar1->data) {
          lVar8 = 3;
          while (pnVar5->level[lVar8 + -3] == pnVar1->level[lVar8 + -3]) {
            if ((pnVar5->level[lVar8 + -3] == 0) || (bVar11 = lVar8 == 5, lVar8 = lVar8 + 1, bVar11)
               ) {
              *slot = pnVar5;
              return 0;
            }
          }
          puVar9 = pnVar5->conf_file;
          if (pnVar1->conf_file == (u_char *)0x0) {
            log = cf->log;
            if (puVar9 == (u_char *)0x0) {
              if (log->log_level != 0) {
                ngx_log_error_core(1,log,0,
                                   "the default path name \"%V\" has the same name as another default path, but the different levels, you need to redefine one of them in http section"
                                   ,pnVar5);
                return -1;
              }
              return -1;
            }
            if (log->log_level != 0) {
              ngx_log_error_core(1,log,0,
                                 "the path name \"%V\" in %s:%ui has the same name as default path, but the different levels, you need to define default path in http section"
                                 ,pnVar5,puVar9,pnVar5->line);
              return -1;
            }
            return -1;
          }
          nVar12 = pnVar5->line;
          fmt = "the same path name \"%V\" in %s:%ui has the different levels than";
        }
        else {
          puVar9 = pnVar5->conf_file;
          nVar12 = pnVar5->line;
          fmt = "the same path name \"%V\" used in %s:%ui and";
        }
        ngx_conf_log_error(1,cf,0,fmt,pnVar5,puVar9,nVar12);
        return -1;
      }
      nVar10 = nVar10 + 1;
    } while (nVar12 != nVar10);
  }
  plVar7 = (long *)ngx_array_push(&pnVar2->paths);
  if (plVar7 != (long *)0x0) {
    *plVar7 = (long)pnVar1;
    return 0;
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_add_path(ngx_conf_t *cf, ngx_path_t **slot)
{
    ngx_uint_t   i, n;
    ngx_path_t  *path, **p;

    path = *slot;

    p = cf->cycle->paths.elts;
    for (i = 0; i < cf->cycle->paths.nelts; i++) {
        if (p[i]->name.len == path->name.len
            && ngx_strcmp(p[i]->name.data, path->name.data) == 0)
        {
            if (p[i]->data != path->data) {
                ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                   "the same path name \"%V\" "
                                   "used in %s:%ui and",
                                   &p[i]->name, p[i]->conf_file, p[i]->line);
                return NGX_ERROR;
            }

            for (n = 0; n < NGX_MAX_PATH_LEVEL; n++) {
                if (p[i]->level[n] != path->level[n]) {
                    if (path->conf_file == NULL) {
                        if (p[i]->conf_file == NULL) {
                            ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                                      "the default path name \"%V\" has "
                                      "the same name as another default path, "
                                      "but the different levels, you need to "
                                      "redefine one of them in http section",
                                      &p[i]->name);
                            return NGX_ERROR;
                        }

                        ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                                      "the path name \"%V\" in %s:%ui has "
                                      "the same name as default path, but "
                                      "the different levels, you need to "
                                      "define default path in http section",
                                      &p[i]->name, p[i]->conf_file, p[i]->line);
                        return NGX_ERROR;
                    }

                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                      "the same path name \"%V\" in %s:%ui "
                                      "has the different levels than",
                                      &p[i]->name, p[i]->conf_file, p[i]->line);
                    return NGX_ERROR;
                }

                if (p[i]->level[n] == 0) {
                    break;
                }
            }

            *slot = p[i];

            return NGX_OK;
        }
    }

    p = ngx_array_push(&cf->cycle->paths);
    if (p == NULL) {
        return NGX_ERROR;
    }

    *p = path;

    return NGX_OK;
}